

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_json_mapping_base.h
# Opt level: O0

vector<PsbtSignatureDataStruct,_std::allocator<PsbtSignatureDataStruct>_> * __thiscall
cfd::core::JsonObjectVector<cfd::api::json::PsbtSignatureData,_PsbtSignatureDataStruct>::
ConvertToStruct(JsonObjectVector<cfd::api::json::PsbtSignatureData,_PsbtSignatureDataStruct> *this)

{
  bool bVar1;
  vector<PsbtSignatureDataStruct,_std::allocator<PsbtSignatureDataStruct>_> *in_RSI;
  PsbtSignatureDataStruct *in_RDI;
  PsbtSignatureDataStruct data;
  PsbtSignatureData *element;
  const_iterator __end0;
  const_iterator __begin0;
  JsonObjectVector<cfd::api::json::PsbtSignatureData,_PsbtSignatureDataStruct> *__range3;
  vector<PsbtSignatureDataStruct,_std::allocator<PsbtSignatureDataStruct>_> *result;
  vector<cfd::api::json::PsbtSignatureData,_std::allocator<cfd::api::json::PsbtSignatureData>_>
  *in_stack_ffffffffffffff28;
  PsbtSignatureDataStruct *__x;
  PsbtSignatureData *in_stack_ffffffffffffff58;
  __normal_iterator<const_cfd::api::json::PsbtSignatureData_*,_std::vector<cfd::api::json::PsbtSignatureData,_std::allocator<cfd::api::json::PsbtSignatureData>_>_>
  local_28 [2];
  undefined1 local_11;
  
  local_11 = 0;
  __x = in_RDI;
  ::std::vector<PsbtSignatureDataStruct,_std::allocator<PsbtSignatureDataStruct>_>::vector
            ((vector<PsbtSignatureDataStruct,_std::allocator<PsbtSignatureDataStruct>_> *)0x6bb14e);
  local_28[0]._M_current =
       (PsbtSignatureData *)
       ::std::
       vector<cfd::api::json::PsbtSignatureData,_std::allocator<cfd::api::json::PsbtSignatureData>_>
       ::begin(in_stack_ffffffffffffff28);
  ::std::
  vector<cfd::api::json::PsbtSignatureData,_std::allocator<cfd::api::json::PsbtSignatureData>_>::end
            (in_stack_ffffffffffffff28);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_cfd::api::json::PsbtSignatureData_*,_std::vector<cfd::api::json::PsbtSignatureData,_std::allocator<cfd::api::json::PsbtSignatureData>_>_>
                             *)in_RDI,
                            (__normal_iterator<const_cfd::api::json::PsbtSignatureData_*,_std::vector<cfd::api::json::PsbtSignatureData,_std::allocator<cfd::api::json::PsbtSignatureData>_>_>
                             *)in_stack_ffffffffffffff28), bVar1) {
    __gnu_cxx::
    __normal_iterator<const_cfd::api::json::PsbtSignatureData_*,_std::vector<cfd::api::json::PsbtSignatureData,_std::allocator<cfd::api::json::PsbtSignatureData>_>_>
    ::operator*(local_28);
    cfd::api::json::PsbtSignatureData::ConvertToStruct(in_stack_ffffffffffffff58);
    ::std::vector<PsbtSignatureDataStruct,_std::allocator<PsbtSignatureDataStruct>_>::push_back
              (in_RSI,__x);
    PsbtSignatureDataStruct::~PsbtSignatureDataStruct(in_RDI);
    __gnu_cxx::
    __normal_iterator<const_cfd::api::json::PsbtSignatureData_*,_std::vector<cfd::api::json::PsbtSignatureData,_std::allocator<cfd::api::json::PsbtSignatureData>_>_>
    ::operator++(local_28);
  }
  return (vector<PsbtSignatureDataStruct,_std::allocator<PsbtSignatureDataStruct>_> *)__x;
}

Assistant:

std::vector<STRUCT_TYPE> ConvertToStruct() const {
    std::vector<STRUCT_TYPE> result;
    for (const auto& element : *this) {
      STRUCT_TYPE data = element.ConvertToStruct();
      result.push_back(data);
    }
    return result;
  }